

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v6::
basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::do_get(basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
         *this,int index)

{
  bool bVar1;
  int iVar2;
  type tVar3;
  longlong *plVar4;
  int in_EDX;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_RSI;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_RDI;
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *val;
  int num_args;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *pbVar5;
  
  pbVar5 = in_RDI;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::basic_format_arg(in_RDI);
  bVar1 = is_packed(in_RSI);
  if (bVar1) {
    if (in_EDX < 0xd) {
      tVar3 = type(in_RSI,in_EDX);
      pbVar5->type_ = tVar3;
      if (pbVar5->type_ != none_type) {
        plVar4 = (longlong *)(*(long *)(in_RSI + 8) + (long)in_EDX * 0x10);
        (pbVar5->value_).field_0.long_long_value = *plVar4;
        (pbVar5->value_).field_0.string.size = plVar4[1];
      }
    }
  }
  else {
    iVar2 = max_size(in_RSI);
    if (in_EDX < iVar2) {
      plVar4 = (longlong *)(*(long *)(in_RSI + 8) + (long)in_EDX * 0x20);
      (pbVar5->value_).field_0.long_long_value = *plVar4;
      (pbVar5->value_).field_0.string.size = plVar4[1];
      pbVar5->type_ = *(type *)(plVar4 + 2);
    }
  }
  return in_RDI;
}

Assistant:

format_arg do_get(int index) const {
    format_arg arg;
    if (!is_packed()) {
      auto num_args = max_size();
      if (index < num_args) arg = args_[index];
      return arg;
    }
    if (index > internal::max_packed_args) return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::type::none_type) return arg;
    internal::value<Context>& val = arg.value_;
    val = values_[index];
    return arg;
  }